

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O3

bool __thiscall
spvtools::val::ValidationState_t::IsSignedIntVectorType(ValidationState_t *this,uint32_t id)

{
  bool bVar1;
  uint32_t id_00;
  const_iterator cVar2;
  key_type local_14;
  
  cVar2 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->all_definitions_)._M_h,&local_14);
  if (((cVar2.
        super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
        ._M_cur == (__node_type *)0x0) ||
      (*(long *)((long)cVar2.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                       ._M_cur + 0x10) == 0)) ||
     (*(short *)(*(long *)((long)cVar2.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                                 ._M_cur + 0x10) + 0x3a) != 0x17)) {
    bVar1 = false;
  }
  else {
    id_00 = GetComponentType(this,id);
    bVar1 = IsSignedIntScalarType(this,id_00);
  }
  return bVar1;
}

Assistant:

bool ValidationState_t::IsSignedIntVectorType(uint32_t id) const {
  const Instruction* inst = FindDef(id);
  if (!inst) {
    return false;
  }

  if (inst->opcode() == spv::Op::OpTypeVector) {
    return IsSignedIntScalarType(GetComponentType(id));
  }

  return false;
}